

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::GraphicsRobustAccessPass::ClampIndicesForAccessChain
          (GraphicsRobustAccessPass *this,Instruction *access_chain)

{
  uint32_t uVar1;
  Op OVar2;
  int iVar3;
  IRContext *pIVar4;
  FeatureManager *this_00;
  Constant *this_01;
  Type *pTVar5;
  undefined4 extraout_var;
  DiagnosticStream *pDVar6;
  string local_768;
  DiagnosticStream local_748;
  Instruction *local_570;
  Instruction *array_len_1;
  string local_548;
  DiagnosticStream local_528;
  int64_t local_350;
  int64_t index_value;
  Constant *index_constant;
  undefined1 local_338 [4];
  uint32_t num_members;
  string local_318;
  DiagnosticStream local_2f8;
  Instruction *local_120;
  Instruction *array_len;
  Instruction *pIStack_110;
  uint32_t count;
  Instruction *index_inst;
  uint local_100;
  uint32_t index_id;
  uint32_t idx;
  uint32_t num_operands;
  Instruction *pointee_type;
  Instruction *base_type;
  Instruction *base_inst;
  anon_class_48_6_b48f874a clamp_to_count;
  anon_class_56_7_7341d3e9 clamp_to_literal_count;
  anon_class_32_4_97c3a017 clamp_index;
  anon_class_24_3_d10d3925 replace_index;
  undefined1 auStack_38 [7];
  bool have_int64_cap;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  ConstantManager *constant_mgr;
  Instruction *inst;
  Instruction *access_chain_local;
  GraphicsRobustAccessPass *this_local;
  
  constant_mgr = (ConstantManager *)access_chain;
  inst = access_chain;
  access_chain_local = (Instruction *)this;
  pIVar4 = Pass::context(&this->super_Pass);
  def_use_mgr = (DefUseManager *)IRContext::get_constant_mgr(pIVar4);
  pIVar4 = Pass::context(&this->super_Pass);
  type_mgr = (TypeManager *)IRContext::get_def_use_mgr(pIVar4);
  pIVar4 = Pass::context(&this->super_Pass);
  _auStack_38 = IRContext::get_type_mgr(pIVar4);
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_feature_mgr(pIVar4);
  clamp_to_literal_count.type_mgr._0_1_ = FeatureManager::HasCapability(this_00,CapabilityInt64);
  clamp_to_literal_count.clamp_index = (anon_class_32_4_97c3a017 *)constant_mgr;
  clamp_index.inst = (Instruction *)_auStack_38;
  clamp_index.this = (GraphicsRobustAccessPass *)&clamp_index.replace_index;
  clamp_to_count.type_mgr = (TypeManager **)constant_mgr;
  clamp_to_literal_count.this = (GraphicsRobustAccessPass *)&def_use_mgr;
  clamp_to_literal_count.constant_mgr = (ConstantManager **)auStack_38;
  clamp_to_literal_count._32_8_ = &clamp_index.replace_index;
  clamp_to_literal_count.replace_index =
       (anon_class_24_3_d10d3925 *)&clamp_to_literal_count.clamp_index;
  base_inst = (Instruction *)constant_mgr;
  clamp_to_count.this = (GraphicsRobustAccessPass *)&def_use_mgr;
  clamp_to_count.constant_mgr = (ConstantManager **)&clamp_to_count.type_mgr;
  clamp_to_count.clamp_to_literal_count =
       (anon_class_56_7_7341d3e9 *)&clamp_to_literal_count.clamp_index;
  clamp_to_count.clamp_index = (anon_class_32_4_97c3a017 *)auStack_38;
  clamp_to_count.inst = (Instruction *)this;
  clamp_to_literal_count.inst = (Instruction *)this;
  clamp_index.type_mgr = (TypeManager *)this;
  clamp_index.replace_index = (anon_class_24_3_d10d3925 *)this;
  uVar1 = opt::Instruction::GetSingleWordInOperand((Instruction *)constant_mgr,0);
  base_type = GetDef(this,uVar1);
  uVar1 = opt::Instruction::type_id(base_type);
  pointee_type = GetDef(this,uVar1);
  uVar1 = opt::Instruction::GetSingleWordInOperand(pointee_type,1);
  _idx = GetDef(this,uVar1);
  index_id = opt::Instruction::NumOperands((Instruction *)constant_mgr);
  local_100 = 3;
  do {
    if (((this->super_Pass).field_0x35 & 1) != 0 || index_id <= local_100) {
      return;
    }
    index_inst._4_4_ = opt::Instruction::GetSingleWordOperand((Instruction *)constant_mgr,local_100)
    ;
    pIStack_110 = GetDef(this,index_inst._4_4_);
    OVar2 = opt::Instruction::opcode(_idx);
    switch(OVar2) {
    case OpTypeVector:
    case OpTypeMatrix:
      array_len._4_4_ = opt::Instruction::GetSingleWordOperand(_idx,2);
      ClampIndicesForAccessChain::anon_class_56_7_7341d3e9::operator()
                ((anon_class_56_7_7341d3e9 *)&clamp_to_count.type_mgr,local_100,
                 (ulong)array_len._4_4_);
      uVar1 = opt::Instruction::GetSingleWordOperand(_idx,1);
      _idx = GetDef(this,uVar1);
      break;
    default:
      Fail(&local_748,this);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_748,(char (*) [42])" Unhandled pointee type for access chain ");
      opt::Instruction::PrettyPrint_abi_cxx11_(&local_768,_idx,0x40);
      DiagnosticStream::operator<<(pDVar6,&local_768);
      std::__cxx11::string::~string((string *)&local_768);
      DiagnosticStream::~DiagnosticStream(&local_748);
      break;
    case OpTypeArray:
      uVar1 = opt::Instruction::GetSingleWordOperand(_idx,2);
      local_120 = GetDef(this,uVar1);
      ClampIndicesForAccessChain::anon_class_48_6_b48f874a::operator()
                ((anon_class_48_6_b48f874a *)&base_inst,local_100,local_120);
      uVar1 = opt::Instruction::GetSingleWordOperand(_idx,1);
      _idx = GetDef(this,uVar1);
      break;
    case OpTypeRuntimeArray:
      local_570 = MakeRuntimeArrayLengthInst(this,(Instruction *)constant_mgr,local_100);
      if (local_570 == (Instruction *)0x0) {
        return;
      }
      ClampIndicesForAccessChain::anon_class_48_6_b48f874a::operator()
                ((anon_class_48_6_b48f874a *)&base_inst,local_100,local_570);
      if (((this->super_Pass).field_0x35 & 1) != 0) {
        return;
      }
      uVar1 = opt::Instruction::GetSingleWordOperand(_idx,1);
      _idx = GetDef(this,uVar1);
      break;
    case OpTypeStruct:
      OVar2 = opt::Instruction::opcode(pIStack_110);
      if (OVar2 != OpConstant) {
LAB_009e63ad:
        Fail(&local_2f8,this);
        pDVar6 = DiagnosticStream::operator<<
                           (&local_2f8,
                            (char (*) [53])"Member index into struct is not a constant integer: ");
        opt::Instruction::PrettyPrint_abi_cxx11_(&local_318,pIStack_110,0x40);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_318);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [19])"\nin access chain: ");
        opt::Instruction::PrettyPrint_abi_cxx11_
                  ((string *)local_338,(Instruction *)constant_mgr,0x40);
        DiagnosticStream::operator<<
                  (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_338);
        std::__cxx11::string::~string((string *)local_338);
        std::__cxx11::string::~string((string *)&local_318);
        DiagnosticStream::~DiagnosticStream(&local_2f8);
        return;
      }
      this_01 = analysis::ConstantManager::GetConstantFromInst
                          ((ConstantManager *)def_use_mgr,pIStack_110);
      pTVar5 = analysis::Constant::type(this_01);
      iVar3 = (*pTVar5->_vptr_Type[10])();
      if (CONCAT44(extraout_var,iVar3) == 0) goto LAB_009e63ad;
      index_constant._4_4_ = opt::Instruction::NumInOperands(_idx);
      index_value = (int64_t)analysis::ConstantManager::GetConstantFromInst
                                       ((ConstantManager *)def_use_mgr,pIStack_110);
      local_350 = analysis::Constant::GetSignExtendedValue((Constant *)index_value);
      if ((local_350 < 0) || ((long)(ulong)index_constant._4_4_ <= local_350)) {
        Fail(&local_528,this);
        pDVar6 = DiagnosticStream::operator<<(&local_528,(char (*) [14])"Member index ");
        pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_350);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(char (*) [36])" is out of bounds for struct type: ");
        opt::Instruction::PrettyPrint_abi_cxx11_(&local_548,_idx,0x40);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_548);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [19])"\nin access chain: ");
        opt::Instruction::PrettyPrint_abi_cxx11_
                  ((string *)&array_len_1,(Instruction *)constant_mgr,0x40);
        DiagnosticStream::operator<<
                  (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &array_len_1);
        std::__cxx11::string::~string((string *)&array_len_1);
        std::__cxx11::string::~string((string *)&local_548);
        DiagnosticStream::~DiagnosticStream(&local_528);
        return;
      }
      uVar1 = opt::Instruction::GetSingleWordInOperand(_idx,(uint32_t)local_350);
      _idx = GetDef(this,uVar1);
    }
    local_100 = local_100 + 1;
  } while( true );
}

Assistant:

void GraphicsRobustAccessPass::ClampIndicesForAccessChain(
    Instruction* access_chain) {
  Instruction& inst = *access_chain;

  auto* constant_mgr = context()->get_constant_mgr();
  auto* def_use_mgr = context()->get_def_use_mgr();
  auto* type_mgr = context()->get_type_mgr();
  const bool have_int64_cap =
      context()->get_feature_mgr()->HasCapability(spv::Capability::Int64);

  // Replaces one of the OpAccessChain index operands with a new value.
  // Updates def-use analysis.
  auto replace_index = [this, &inst, def_use_mgr](uint32_t operand_index,
                                                  Instruction* new_value) {
    inst.SetOperand(operand_index, {new_value->result_id()});
    def_use_mgr->AnalyzeInstUse(&inst);
    module_status_.modified = true;
    return SPV_SUCCESS;
  };

  // Replaces one of the OpAccesssChain index operands with a clamped value.
  // Replace the operand at |operand_index| with the value computed from
  // signed_clamp(%old_value, %min_value, %max_value).  It also analyzes
  // the new instruction and records that them module is modified.
  // Assumes %min_value is signed-less-or-equal than %max_value. (All callees
  // use 0 for %min_value).
  auto clamp_index = [&inst, type_mgr, this, &replace_index](
                         uint32_t operand_index, Instruction* old_value,
                         Instruction* min_value, Instruction* max_value) {
    auto* clamp_inst =
        MakeSClampInst(*type_mgr, old_value, min_value, max_value, &inst);
    return replace_index(operand_index, clamp_inst);
  };

  // Ensures the specified index of access chain |inst| has a value that is
  // at most |count| - 1.  If the index is already a constant value less than
  // |count| then no change is made.
  auto clamp_to_literal_count =
      [&inst, this, &constant_mgr, &type_mgr, have_int64_cap, &replace_index,
       &clamp_index](uint32_t operand_index, uint64_t count) -> spv_result_t {
    Instruction* index_inst =
        this->GetDef(inst.GetSingleWordOperand(operand_index));
    const auto* index_type =
        type_mgr->GetType(index_inst->type_id())->AsInteger();
    assert(index_type);
    const auto index_width = index_type->width();

    if (count <= 1) {
      // Replace the index with 0.
      return replace_index(operand_index, GetValueForType(0, index_type));
    }

    uint64_t maxval = count - 1;

    // Compute the bit width of a viable type to hold |maxval|.
    // Look for a bit width, up to 64 bits wide, to fit maxval.
    uint32_t maxval_width = index_width;
    while ((maxval_width < 64) && (0 != (maxval >> maxval_width))) {
      maxval_width *= 2;
    }
    // Determine the type for |maxval|.
    uint32_t next_id = context()->module()->IdBound();
    analysis::Integer signed_type_for_query(maxval_width, true);
    auto* maxval_type =
        type_mgr->GetRegisteredType(&signed_type_for_query)->AsInteger();
    if (next_id != context()->module()->IdBound()) {
      module_status_.modified = true;
    }
    // Access chain indices are treated as signed, so limit the maximum value
    // of the index so it will always be positive for a signed clamp operation.
    maxval = std::min(maxval, ((uint64_t(1) << (maxval_width - 1)) - 1));

    if (index_width > 64) {
      return this->Fail() << "Can't handle indices wider than 64 bits, found "
                             "constant index with "
                          << index_width << " bits as index number "
                          << operand_index << " of access chain "
                          << inst.PrettyPrint();
    }

    // Split into two cases: the current index is a constant, or not.

    // If the index is a constant then |index_constant| will not be a null
    // pointer.  (If index is an |OpConstantNull| then it |index_constant| will
    // not be a null pointer.)  Since access chain indices must be scalar
    // integers, this can't be a spec constant.
    if (auto* index_constant = constant_mgr->GetConstantFromInst(index_inst)) {
      auto* int_index_constant = index_constant->AsIntConstant();
      int64_t value = 0;
      // OpAccessChain indices are treated as signed.  So get the signed
      // constant value here.
      if (index_width <= 32) {
        value = int64_t(int_index_constant->GetS32BitValue());
      } else if (index_width <= 64) {
        value = int_index_constant->GetS64BitValue();
      }
      if (value < 0) {
        return replace_index(operand_index, GetValueForType(0, index_type));
      } else if (uint64_t(value) <= maxval) {
        // Nothing to do.
        return SPV_SUCCESS;
      } else {
        // Replace with maxval.
        assert(count > 0);  // Already took care of this case above.
        return replace_index(operand_index,
                             GetValueForType(maxval, maxval_type));
      }
    } else {
      // Generate a clamp instruction.
      assert(maxval >= 1);
      assert(index_width <= 64);  // Otherwise, already returned above.
      if (index_width >= 64 && !have_int64_cap) {
        // An inconsistent module.
        return Fail() << "Access chain index is wider than 64 bits, but Int64 "
                         "is not declared: "
                      << index_inst->PrettyPrint();
      }
      // Widen the index value if necessary
      if (maxval_width > index_width) {
        // Find the wider type.  We only need this case if a constant array
        // bound is too big.

        // From how we calculated maxval_width, widening won't require adding
        // the Int64 capability.
        assert(have_int64_cap || maxval_width <= 32);
        if (!have_int64_cap && maxval_width >= 64) {
          // Be defensive, but this shouldn't happen.
          return this->Fail()
                 << "Clamping index would require adding Int64 capability. "
                 << "Can't clamp 32-bit index " << operand_index
                 << " of access chain " << inst.PrettyPrint();
        }
        index_inst = WidenInteger(index_type->IsSigned(), maxval_width,
                                  index_inst, &inst);
      }

      // Finally, clamp the index.
      return clamp_index(operand_index, index_inst,
                         GetValueForType(0, maxval_type),
                         GetValueForType(maxval, maxval_type));
    }
    return SPV_SUCCESS;
  };

  // Ensures the specified index of access chain |inst| has a value that is at
  // most the value of |count_inst| minus 1, where |count_inst| is treated as an
  // unsigned integer. This can log a failure.
  auto clamp_to_count = [&inst, this, &constant_mgr, &clamp_to_literal_count,
                         &clamp_index,
                         &type_mgr](uint32_t operand_index,
                                    Instruction* count_inst) -> spv_result_t {
    Instruction* index_inst =
        this->GetDef(inst.GetSingleWordOperand(operand_index));
    const auto* index_type =
        type_mgr->GetType(index_inst->type_id())->AsInteger();
    const auto* count_type =
        type_mgr->GetType(count_inst->type_id())->AsInteger();
    assert(index_type);
    if (const auto* count_constant =
            constant_mgr->GetConstantFromInst(count_inst)) {
      uint64_t value = 0;
      const auto width = count_constant->type()->AsInteger()->width();
      if (width <= 32) {
        value = count_constant->AsIntConstant()->GetU32BitValue();
      } else if (width <= 64) {
        value = count_constant->AsIntConstant()->GetU64BitValue();
      } else {
        return this->Fail() << "Can't handle indices wider than 64 bits, found "
                               "constant index with "
                            << index_type->width() << "bits";
      }
      return clamp_to_literal_count(operand_index, value);
    } else {
      // Widen them to the same width.
      const auto index_width = index_type->width();
      const auto count_width = count_type->width();
      const auto target_width = std::max(index_width, count_width);
      // UConvert requires the result type to have 0 signedness.  So enforce
      // that here.
      auto* wider_type = index_width < count_width ? count_type : index_type;
      if (index_type->width() < target_width) {
        // Access chain indices are treated as signed integers.
        index_inst = WidenInteger(true, target_width, index_inst, &inst);
      } else if (count_type->width() < target_width) {
        // Assume type sizes are treated as unsigned.
        count_inst = WidenInteger(false, target_width, count_inst, &inst);
      }
      // Compute count - 1.
      // It doesn't matter if 1 is signed or unsigned.
      auto* one = GetValueForType(1, wider_type);
      auto* count_minus_1 = InsertInst(
          &inst, spv::Op::OpISub, type_mgr->GetId(wider_type), TakeNextId(),
          {{SPV_OPERAND_TYPE_ID, {count_inst->result_id()}},
           {SPV_OPERAND_TYPE_ID, {one->result_id()}}});
      auto* zero = GetValueForType(0, wider_type);
      // Make sure we clamp to an upper bound that is at most the signed max
      // for the target type.
      const uint64_t max_signed_value =
          ((uint64_t(1) << (target_width - 1)) - 1);
      // Use unsigned-min to ensure that the result is always non-negative.
      // That ensures we satisfy the invariant for SClamp, where the "min"
      // argument we give it (zero), is no larger than the third argument.
      auto* upper_bound =
          MakeUMinInst(*type_mgr, count_minus_1,
                       GetValueForType(max_signed_value, wider_type), &inst);
      // Now clamp the index to this upper bound.
      return clamp_index(operand_index, index_inst, zero, upper_bound);
    }
    return SPV_SUCCESS;
  };

  const Instruction* base_inst = GetDef(inst.GetSingleWordInOperand(0));
  const Instruction* base_type = GetDef(base_inst->type_id());
  Instruction* pointee_type = GetDef(base_type->GetSingleWordInOperand(1));

  // Walk the indices from earliest to latest, replacing indices with a
  // clamped value, and updating the pointee_type.  The order matters for
  // the case when we have to compute the length of a runtime array.  In
  // that the algorithm relies on the fact that that the earlier indices
  // have already been clamped.
  const uint32_t num_operands = inst.NumOperands();
  for (uint32_t idx = 3; !module_status_.failed && idx < num_operands; ++idx) {
    const uint32_t index_id = inst.GetSingleWordOperand(idx);
    Instruction* index_inst = GetDef(index_id);

    switch (pointee_type->opcode()) {
      case spv::Op::OpTypeMatrix:  // Use column count
      case spv::Op::OpTypeVector:  // Use component count
      {
        const uint32_t count = pointee_type->GetSingleWordOperand(2);
        clamp_to_literal_count(idx, count);
        pointee_type = GetDef(pointee_type->GetSingleWordOperand(1));
      } break;

      case spv::Op::OpTypeArray: {
        // The array length can be a spec constant, so go through the general
        // case.
        Instruction* array_len = GetDef(pointee_type->GetSingleWordOperand(2));
        clamp_to_count(idx, array_len);
        pointee_type = GetDef(pointee_type->GetSingleWordOperand(1));
      } break;

      case spv::Op::OpTypeStruct: {
        // SPIR-V requires the index to be an OpConstant.
        // We need to know the index literal value so we can compute the next
        // pointee type.
        if (index_inst->opcode() != spv::Op::OpConstant ||
            !constant_mgr->GetConstantFromInst(index_inst)
                 ->type()
                 ->AsInteger()) {
          Fail() << "Member index into struct is not a constant integer: "
                 << index_inst->PrettyPrint(
                        SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
                 << "\nin access chain: "
                 << inst.PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
          return;
        }
        const auto num_members = pointee_type->NumInOperands();
        const auto* index_constant =
            constant_mgr->GetConstantFromInst(index_inst);
        // Get the sign-extended value, since access index is always treated as
        // signed.
        const auto index_value = index_constant->GetSignExtendedValue();
        if (index_value < 0 || index_value >= num_members) {
          Fail() << "Member index " << index_value
                 << " is out of bounds for struct type: "
                 << pointee_type->PrettyPrint(
                        SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
                 << "\nin access chain: "
                 << inst.PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
          return;
        }
        pointee_type = GetDef(pointee_type->GetSingleWordInOperand(
            static_cast<uint32_t>(index_value)));
        // No need to clamp this index.  We just checked that it's valid.
      } break;

      case spv::Op::OpTypeRuntimeArray: {
        auto* array_len = MakeRuntimeArrayLengthInst(&inst, idx);
        if (!array_len) {  // We've already signaled an error.
          return;
        }
        clamp_to_count(idx, array_len);
        if (module_status_.failed) return;
        pointee_type = GetDef(pointee_type->GetSingleWordOperand(1));
      } break;

      default:
        Fail() << " Unhandled pointee type for access chain "
               << pointee_type->PrettyPrint(
                      SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    }
  }
}